

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O1

void pltcalc::
     read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
               (_func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,FILE **fout,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp)

{
  sampleslevelRec sVar1;
  bool bVar2;
  size_t sVar3;
  float impacted_exposure;
  OASIS_FLOAT OVar4;
  sampleslevelRec sr;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  int summary_set;
  summarySampleslevelHeader sh;
  sampleslevelRec local_b0;
  OASIS_FLOAT local_a8;
  float local_a4;
  float local_a0;
  OASIS_FLOAT local_9c;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> local_98;
  _func_void_outrec_ptr_int_FILE_ptr *local_78;
  FILE *local_70;
  FILE **local_68;
  undefined4 local_5c;
  undefined1 local_58 [16];
  summarySampleslevelHeader local_3c;
  
  local_5c = 0;
  local_78 = OutputData;
  local_70 = outFile;
  local_68 = fout;
  sVar3 = fread(&local_5c,4,1,_stdin);
  local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_start = (sampleslevelRec *)0x0;
  local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_finish = (sampleslevelRec *)0x0;
  local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (sampleslevelRec *)0x0;
  if (sVar3 != 0) {
    do {
      sVar3 = fread(&local_3c,0xc,1,_stdin);
      local_a0 = 0.0;
      local_a4 = 0.0;
      local_9c = 0.0;
      local_a8 = 0.0;
      do {
        if (sVar3 == 0) {
          sVar3 = 0;
          break;
        }
        sVar3 = fread(&local_b0,8,1,_stdin);
        if (local_b0.sidx == -4) {
LAB_00103803:
          bVar2 = false;
        }
        else {
          if (sVar3 != 0 && local_b0.sidx != 0) {
            local_58 = ZEXT816(0);
            if (-2 < local_b0.sidx) {
              impacted_exposure =
                   (float)(-(uint)(0.0 < local_b0.loss) & 0x3f800000) * local_3c.expval;
              local_58 = ZEXT416((uint)impacted_exposure);
              outputrows_splt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                        (&local_3c,&local_b0,local_68[1],m_occ,vp,impacted_exposure);
            }
            if (local_b0.sidx == -1) {
              domeanout<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                        (&local_3c,local_b0.loss,local_78,local_70,m_occ,vp,0.0,local_9c);
            }
            else {
              if (local_b0.sidx != -5) {
                if (local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<sampleslevelRec,std::allocator<sampleslevelRec>>::
                  _M_realloc_insert<sampleslevelRec_const&>
                            ((vector<sampleslevelRec,std::allocator<sampleslevelRec>> *)&local_98,
                             (iterator)
                             local_98.
                             super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_b0);
                }
                else {
                  sVar1.loss = local_b0.loss;
                  sVar1.sidx = local_b0.sidx;
                  *local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                   _M_impl.super__Vector_impl_data._M_finish = sVar1;
                  local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_98.
                       super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
                       .super__Vector_impl_data._M_finish + 1;
                }
                local_a0 = local_a0 + (float)local_58._0_4_ / (float)samplesize_;
                OVar4 = (OASIS_FLOAT)local_58._0_4_;
                if ((float)local_58._0_4_ <= local_a8) {
                  OVar4 = local_a8;
                }
                local_a4 = local_a4 +
                           (float)(-(uint)(0.0 < local_b0.loss) & 0x3f800000) / (float)samplesize_;
                bVar2 = false;
                local_a8 = OVar4;
                goto LAB_00103805;
              }
              local_9c = local_b0.loss;
            }
            goto LAB_00103803;
          }
          dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&local_3c,&local_98,local_78,local_70,m_occ,vp,local_a8,local_a0,local_a4,
                     local_9c);
          outputrows_qplt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    (&local_3c,&local_98,local_68[2],m_occ,vp);
          bVar2 = true;
          if (local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl
              .super__Vector_impl_data._M_start) {
            local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
        }
LAB_00103805:
      } while (!bVar2);
    } while (sVar3 != 0);
  }
  if (local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
      super__Vector_impl_data._M_start != (sampleslevelRec *)0x0) {
    operator_delete(local_98.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void read_input(void (*OutputData)(const T&, const int, FILE*),
			       FILE * outFile, FILE ** fout,
			       moccT &m_occ, periodT &vp)
	{
		int summary_set = 0;
		size_t i = fread(&summary_set, sizeof(summary_set), 1, stdin);
		std::vector<sampleslevelRec> vrec;
		summarySampleslevelHeader sh;
		while (i != 0) {
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			OASIS_FLOAT max_loss = 0;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0) {
				OASIS_FLOAT impacted_exposure = 0;
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (sr.sidx == number_of_affected_risk_idx) continue;
				if (i == 0 || sr.sidx == 0) {
					dopltcalc(sh, vrec, OutputData, outFile,
						  m_occ, vp,
						  max_impacted_exposure,
						  mean_impacted_exposure,
						  chance_of_loss, max_loss);
					outputrows_qplt(sh, vrec, fout[QPLT],
							m_occ, vp);
					vrec.clear();
					break;
				} else if (sr.sidx >= -1) {
					impacted_exposure = sh.expval * (sr.loss > 0);
					outputrows_splt(sh, sr, fout[SPLT],
							m_occ, vp,
							impacted_exposure);
				}

				if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				} else if (sr.sidx == mean_idx) {
					domeanout(sh, sr.loss, OutputData,
						  outFile, m_occ, vp, 0.0,
						  max_loss);
				} else {
					vrec.push_back(sr);
					mean_impacted_exposure += impacted_exposure / samplesize_;
					if (impacted_exposure > max_impacted_exposure) {
						max_impacted_exposure = impacted_exposure;
					}
					chance_of_loss += (sr.loss > 0) / (OASIS_FLOAT)samplesize_;   // Relative frequency
				}
			}
		}
	}